

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_average.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::time_average
          (NavierStokesBase *this,Real *a_time_avg,Real *a_time_avg_fluct,Real *a_dt_avg,
          Real *dt_level)

{
  double dVar1;
  double dVar2;
  pointer pSVar3;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_02;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  Real RVar18;
  double dVar19;
  MFIter mfi;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  *a_dt_avg = *a_dt_avg + *dt_level;
  if (*(((this->super_AmrLevel).parent)->level_steps).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
      avg_interval == 0) {
    pSVar3 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (pSVar3->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         pSVar3[Average_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    this_02.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         pSVar3[Average_Type].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::MFIter::MFIter
              (&local_90,
               (FabArrayBase *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_16c,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90,0);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)
                   this_01.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_150,
                   (FabArray<amrex::FArrayBox> *)
                   this_02.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
        iVar5 = compute_fluctuations;
        lVar13 = (long)local_16c.smallend.vect[0];
        lVar9 = (long)local_16c.smallend.vect[1];
        lVar6 = local_110.jstride * 8;
        lVar12 = (lVar9 - local_110.begin.y) * lVar6 + lVar13 * 8;
        local_200 = lVar12 + local_110.nstride * 0x18 + (long)local_110.begin.x * -8 +
                    (long)local_110.p;
        local_1f8 = lVar12 + (long)local_110.begin.x * -8 + (long)local_110.p;
        dVar1 = *a_dt_avg;
        lVar11 = local_150.jstride * 8;
        lVar12 = (lVar9 - local_150.begin.y) * lVar11 + lVar13 * 8;
        dVar2 = *a_time_avg;
        local_218 = lVar12 + local_150.nstride * 0x18 + (long)local_150.begin.x * -8 +
                    (long)local_150.p;
        local_210 = lVar12 + (long)local_150.begin.x * -8 + (long)local_150.p;
        local_208 = (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 + lVar13 * 8 +
                    (long)local_d0.begin.x * -8 + (long)local_d0.p;
        lVar12 = 0;
        do {
          iVar4 = local_16c.smallend.vect[2];
          if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
            do {
              if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
                lVar7 = (long)iVar4;
                lVar16 = (lVar7 - local_110.begin.z) * local_110.kstride * 8;
                lVar13 = local_200 + lVar16;
                lVar16 = lVar16 + local_1f8;
                lVar14 = (lVar7 - local_d0.begin.z) * local_d0.kstride * 8 + local_208;
                lVar8 = (lVar7 - local_150.begin.z) * local_150.kstride * 8;
                lVar10 = local_218 + lVar8;
                lVar8 = lVar8 + local_210;
                lVar7 = lVar9;
                do {
                  if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                    lVar15 = 0;
                    do {
                      dVar19 = *(double *)(lVar14 + lVar15 * 8) * dVar1 +
                               *(double *)(lVar8 + lVar15 * 8);
                      *(double *)(lVar16 + lVar15 * 8) = dVar19;
                      *(double *)(lVar8 + lVar15 * 8) = dVar19;
                      dVar19 = 0.0;
                      if (iVar5 == 1) {
                        dVar19 = *(double *)(lVar14 + lVar15 * 8) -
                                 *(double *)(lVar16 + lVar15 * 8) / (dVar2 + dVar1);
                        dVar19 = dVar1 * dVar19 * dVar19 + *(double *)(lVar10 + lVar15 * 8);
                      }
                      *(double *)(lVar13 + lVar15 * 8) = dVar19;
                      *(double *)(lVar10 + lVar15 * 8) = dVar19;
                      lVar15 = lVar15 + 1;
                    } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 !=
                             (int)lVar15);
                  }
                  lVar7 = lVar7 + 1;
                  lVar13 = lVar13 + lVar6;
                  lVar16 = lVar16 + lVar6;
                  lVar14 = lVar14 + local_d0.jstride * 8;
                  lVar10 = lVar10 + lVar11;
                  lVar8 = lVar8 + lVar11;
                } while (local_16c.bigend.vect[1] + 1 != (int)lVar7);
              }
              bVar17 = iVar4 != local_16c.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar17);
          }
          lVar12 = lVar12 + 1;
          local_200 = local_200 + local_110.nstride * 8;
          local_1f8 = local_1f8 + local_110.nstride * 8;
          local_208 = local_208 + local_d0.nstride * 8;
          local_218 = local_218 + local_150.nstride * 8;
          local_210 = local_210 + local_150.nstride * 8;
        } while (lVar12 != 3);
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    amrex::MFIter::~MFIter(&local_90);
    *a_time_avg = *a_time_avg + *a_dt_avg;
    if (compute_fluctuations == 1) {
      RVar18 = *a_time_avg_fluct + *a_dt_avg;
    }
    else {
      RVar18 = 0.0;
    }
    *a_time_avg_fluct = RVar18;
    *a_dt_avg = 0.0;
  }
  return;
}

Assistant:

void
NavierStokesBase::time_average(amrex::Real&  a_time_avg, amrex::Real&  a_time_avg_fluct, amrex::Real&  a_dt_avg, const Real& dt_level)

{
  a_dt_avg = a_dt_avg + dt_level;

  if (parent->levelSteps(0)%avg_interval == 0)
  {
    MultiFab& Sstate = get_new_data(State_Type);
    MultiFab& Savg   = get_new_data(Average_Type); 
    MultiFab& Savg_old   = get_old_data(Average_Type);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Savg,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& S_state = Sstate.array(mfi,Xvel);
       auto const& S_avg   = Savg.array(mfi);
       auto const& S_avg_old   = Savg_old.array(mfi);
       int loc_compute_fluctuations = compute_fluctuations; //NavierStokesBase class cannot be accessed directly fron device

       amrex::ParallelFor(bx, BL_SPACEDIM, [S_state, S_avg, S_avg_old, a_dt_avg, a_time_avg, loc_compute_fluctuations]
       AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
       {
          S_avg(i,j,k,n) = S_avg_old(i,j,k,n) + a_dt_avg * S_state(i,j,k,n);
          S_avg_old(i,j,k,n) = S_avg(i,j,k,n);

          if (loc_compute_fluctuations == 1){
            amrex::Real vel_prime = S_state(i,j,k,n) - (S_avg(i,j,k,n)/(a_time_avg + a_dt_avg));
            S_avg(i,j,k,n+BL_SPACEDIM) = S_avg_old(i,j,k,n+BL_SPACEDIM) + a_dt_avg * vel_prime * vel_prime;
          }
          else{
            S_avg(i,j,k,n+BL_SPACEDIM) = 0.;
          }
          S_avg_old(i,j,k,n+BL_SPACEDIM) = S_avg(i,j,k,n+BL_SPACEDIM);
       });
    }

    a_time_avg = a_time_avg + a_dt_avg;
    if (compute_fluctuations == 1){
      a_time_avg_fluct = a_time_avg_fluct + a_dt_avg;
    }else{
      a_time_avg_fluct = 0.;
    }

    a_dt_avg = 0;

  }
}